

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O0

bool __thiscall
HighsMipSolverData::interruptFromCallbackWithData
          (HighsMipSolverData *this,int callback_type,double mipsolver_objective_value,
          string *message)

{
  bool bVar1;
  HighsCallback *in_RDX;
  undefined4 in_ESI;
  HighsMipSolverData *in_RDI;
  undefined8 in_XMM0_Qa;
  int in_stack_ffffffffffffff94;
  string local_48 [32];
  HighsCallback *message_00;
  int callback_type_00;
  undefined4 in_stack_ffffffffffffffe8;
  bool local_1;
  
  callback_type_00 = (int)((ulong)in_XMM0_Qa >> 0x20);
  message_00 = in_RDX;
  bVar1 = HighsCallback::callbackActive(in_RDX,in_stack_ffffffffffffff94);
  if (bVar1) {
    setCallbackDataOut(in_RDI,(double)in_RDX);
    std::__cxx11::string::string(local_48,(string *)in_RDX);
    local_1 = HighsCallback::callbackAction
                        ((HighsCallback *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                         callback_type_00,(string *)message_00);
    std::__cxx11::string::~string(local_48);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool HighsMipSolverData::interruptFromCallbackWithData(
    const int callback_type, const double mipsolver_objective_value,
    const std::string message) const {
  if (!mipsolver.callback_->callbackActive(callback_type)) return false;
  assert(!mipsolver.submip);
  setCallbackDataOut(mipsolver_objective_value);
  return mipsolver.callback_->callbackAction(callback_type, message);
}